

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O1

bool __thiscall
prometheus::detail::MetricsHandler::handleGet
          (MetricsHandler *this,CivetServer *param_1,mg_connection *conn)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  undefined8 uVar5;
  pointer puVar6;
  __pthread_internal_list *__mutex;
  pointer buf;
  undefined1 auVar7 [16];
  undefined1 local_108 [24];
  undefined1 local_f0 [32];
  long local_d0;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  TextSerializer serializer;
  z_stream zs;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = (__pthread_internal_list *)&this->collectables_mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    uVar5 = std::__throw_system_error(iVar1);
    if ((pointer)local_108._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._0_8_);
    }
    if ((pointer)local_f0._0_8_ != (pointer)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_);
    }
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              (&metrics);
    _Unwind_Resume(uVar5);
  }
  CollectMetrics((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                 local_f0,&this->collectables_);
  zs.total_in = (uLong)metrics.
                       super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  zs._8_8_ = metrics.
             super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  zs.next_in = (Bytef *)metrics.
                        super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                        ._M_impl.super__Vector_impl_data._M_start;
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_f0._0_8_;
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_f0._8_8_;
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f0._16_8_;
  local_f0._0_8_ = (__pthread_internal_list *)0x0;
  local_f0._8_8_ = (__pthread_internal_list *)0x0;
  local_f0._16_8_ = (pointer)0x0;
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)&zs);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)local_f0
            );
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  serializer.super_Serializer._vptr_Serializer = (Serializer)&PTR__Serializer_00186cf0;
  Serializer::Serialize_abi_cxx11_((string *)local_f0,&serializer.super_Serializer,&metrics);
  mg_printf(conn,"HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=utf-8\r\n");
  pcVar3 = mg_get_header(conn,"Accept-Encoding");
  if (pcVar3 != (char *)0x0) {
    pcVar3 = strstr(pcVar3,"gzip");
    if (pcVar3 != (char *)0x0) {
      zs.adler = 0;
      zs.reserved = 0;
      zs.opaque = (voidpf)0x0;
      zs.data_type = 0;
      zs._92_4_ = 0;
      zs.zalloc = (alloc_func)0x0;
      zs.zfree = (free_func)0x0;
      zs.msg = (char *)0x0;
      zs.state = (internal_state *)0x0;
      zs.avail_out = 0;
      zs._36_4_ = 0;
      zs.total_out = 0;
      zs.total_in = 0;
      zs.next_out = (Bytef *)0x0;
      zs.next_in = (Bytef *)0x0;
      zs.avail_in = 0;
      zs._12_4_ = 0;
      iVar1 = deflateInit2_(&zs,0xffffffff,8,0x1f,9,0,"1.2.11",0x70);
      if (iVar1 == 0) {
        zs.next_in = (Bytef *)local_f0._0_8_;
        zs.avail_in = (uInt)local_f0._8_8_;
        local_108._0_8_ = (pointer)0x0;
        local_108._8_8_ = (pointer)0x0;
        local_108._16_8_ = (pointer)0x0;
        local_d0 = lVar2;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,
                   (ulong)local_f0._8_8_ >> 1);
        do {
          zs.avail_out = 0x8000;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,
                     zs.total_out + 0x8000);
          zs.next_out = (Bytef *)(local_108._0_8_ + zs.total_out);
          iVar1 = deflate(&zs,4);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,zs.total_out
                    );
        } while (iVar1 == 0);
        deflateEnd(&zs);
        lVar2 = local_d0;
        puVar6 = (pointer)local_108._8_8_;
        buf = (pointer)local_108._0_8_;
        if (iVar1 == 1) {
          local_108._0_8_ = (pointer)0x0;
          local_108._8_8_ = (pointer)0x0;
          local_108._16_8_ = (pointer)0x0;
        }
        else {
          buf = (pointer)0x0;
          puVar6 = (pointer)0x0;
        }
        __mutex = (__pthread_internal_list *)local_108;
        if ((pointer)local_108._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_108._0_8_);
          __mutex = (__pthread_internal_list *)local_108;
        }
      }
      else {
        buf = (pointer)0x0;
        puVar6 = (pointer)0x0;
      }
      if (buf != puVar6) {
        __mutex = (__pthread_internal_list *)(puVar6 + -(long)buf);
        mg_printf(conn,"Content-Encoding: gzip\r\nContent-Length: %lu\r\n\r\n",__mutex);
        mg_write(conn,buf,(size_t)__mutex);
      }
      if (buf != (pointer)0x0) {
        operator_delete(buf);
      }
      if (buf != puVar6) goto LAB_00122482;
    }
  }
  mg_printf(conn,"Content-Length: %lu\r\n\r\n",local_f0._8_8_);
  mg_write(conn,(void *)local_f0._0_8_,local_f0._8_8_);
  __mutex = (__pthread_internal_list *)local_f0._8_8_;
LAB_00122482:
  if ((__pthread_internal_list *)local_f0._0_8_ != (__pthread_internal_list *)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_);
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  Summary::Observe(this->request_latencies_,(double)((lVar4 - lVar2) / 1000));
  auVar7._8_4_ = (int)((ulong)__mutex >> 0x20);
  auVar7._0_8_ = __mutex;
  auVar7._12_4_ = 0x45300000;
  Counter::Increment(this->bytes_transferred_,
                     (auVar7._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)__mutex) - 4503599627370496.0));
  Counter::Increment(this->num_scrapes_);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            (&metrics);
  return true;
}

Assistant:

bool MetricsHandler::handleGet(CivetServer*, struct mg_connection* conn) {
  auto start_time_of_request = std::chrono::steady_clock::now();

  std::vector<MetricFamily> metrics;

  {
    std::lock_guard<std::mutex> lock{collectables_mutex_};
    metrics = CollectMetrics(collectables_);
  }

  const TextSerializer serializer;

  auto bodySize = WriteResponse(conn, serializer.Serialize(metrics));

  auto stop_time_of_request = std::chrono::steady_clock::now();
  auto duration = std::chrono::duration_cast<std::chrono::microseconds>(
      stop_time_of_request - start_time_of_request);
  request_latencies_.Observe(duration.count());

  bytes_transferred_.Increment(bodySize);
  num_scrapes_.Increment();
  return true;
}